

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_hkdf.cc
# Opt level: O2

void pkey_hkdf_cleanup(EVP_PKEY_CTX *ctx)

{
  void *orig_ptr;
  
  orig_ptr = ctx->data;
  if (orig_ptr != (void *)0x0) {
    OPENSSL_free(*(void **)((long)orig_ptr + 0x10));
    OPENSSL_free(*(void **)((long)orig_ptr + 0x20));
    CBB_cleanup((CBB *)((long)orig_ptr + 0x30));
    OPENSSL_free(orig_ptr);
    ctx->data = (void *)0x0;
  }
  return;
}

Assistant:

static void pkey_hkdf_cleanup(EVP_PKEY_CTX *ctx) {
  HKDF_PKEY_CTX *hctx = reinterpret_cast<HKDF_PKEY_CTX *>(ctx->data);
  if (hctx != NULL) {
    OPENSSL_free(hctx->key);
    OPENSSL_free(hctx->salt);
    CBB_cleanup(&hctx->info);
    OPENSSL_free(hctx);
    ctx->data = NULL;
  }
}